

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswPairs.c
# Opt level: O2

Vec_Int_t *
Ssw_TransferSignalPairs
          (Aig_Man_t *pMiter,Aig_Man_t *pAig1,Aig_Man_t *pAig2,Vec_Int_t *vIds1,Vec_Int_t *vIds2)

{
  int *piVar1;
  int iVar2;
  Vec_Int_t *p;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  ulong uVar5;
  ulong uVar6;
  int i;
  
  p = Vec_IntAlloc(vIds1->nSize * 2);
  i = 0;
  while( true ) {
    if (vIds1->nSize <= i) {
      return p;
    }
    iVar2 = Vec_IntEntry(vIds1,i);
    pAVar3 = Aig_ManObj(pAig1,iVar2);
    iVar2 = Vec_IntEntry(vIds2,i);
    pAVar4 = Aig_ManObj(pAig2,iVar2);
    uVar5 = (ulong)(pAVar3->field_5).pData & 0xfffffffffffffffe;
    if ((uVar5 == 0) || (uVar6 = (ulong)(pAVar4->field_5).pData & 0xfffffffffffffffe, uVar6 == 0))
    break;
    if (uVar5 != uVar6) {
      iVar2 = *(int *)(uVar5 + 0x24);
      piVar1 = (int *)(uVar6 + 0x24);
      if (*piVar1 <= iVar2) {
        uVar6 = uVar5;
        iVar2 = *piVar1;
      }
      Vec_IntPush(p,iVar2);
      Vec_IntPush(p,*(int *)(uVar6 + 0x24));
    }
    i = i + 1;
  }
  __assert_fail("pObj1m && pObj2m",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswPairs.c"
                ,0x79,
                "Vec_Int_t *Ssw_TransferSignalPairs(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *)"
               );
}

Assistant:

Vec_Int_t * Ssw_TransferSignalPairs( Aig_Man_t * pMiter, Aig_Man_t * pAig1, Aig_Man_t * pAig2, Vec_Int_t * vIds1, Vec_Int_t * vIds2 )
{
    Vec_Int_t * vIds;
    Aig_Obj_t * pObj1, * pObj2;
    Aig_Obj_t * pObj1m, * pObj2m;
    int i;
    vIds = Vec_IntAlloc( 2 * Vec_IntSize(vIds1) );
    for ( i = 0; i < Vec_IntSize(vIds1); i++ )
    {
        pObj1 = Aig_ManObj( pAig1, Vec_IntEntry(vIds1, i) );
        pObj2 = Aig_ManObj( pAig2, Vec_IntEntry(vIds2, i) );
        pObj1m = Aig_Regular((Aig_Obj_t *)pObj1->pData);
        pObj2m = Aig_Regular((Aig_Obj_t *)pObj2->pData);
        assert( pObj1m && pObj2m );
        if ( pObj1m == pObj2m )
            continue;
        if ( pObj1m->Id < pObj2m->Id )
        {
            Vec_IntPush( vIds, pObj1m->Id );
            Vec_IntPush( vIds, pObj2m->Id );
        }
        else
        {
            Vec_IntPush( vIds, pObj2m->Id );
            Vec_IntPush( vIds, pObj1m->Id );
        }
    }
    return vIds;
}